

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeAddrMode6Operand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  uint uVar3;
  
  DVar1 = DecodeGPRRegisterClass(Inst,Val & 0xf,Address,Decoder);
  if ((DVar1 | 2) == MCDisassembler_Success) {
    uVar2 = Val >> 4 & 3;
    uVar3 = 4 << (sbyte)uVar2;
    if (uVar2 == 0) {
      uVar3 = 0;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar3);
  }
  else {
    DVar1 = MCDisassembler_Fail;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeAddrMode6Operand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned align = fieldFromInstruction_4(Val, 4, 2);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!align)
		MCOperand_CreateImm0(Inst, 0);
	else
		MCOperand_CreateImm0(Inst, 4 << align);

	return S;
}